

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingNegativeCase::generateShaders
          (UBOBindingNegativeCase *this)

{
  int iVar1;
  ShaderType SVar2;
  ostream *poVar3;
  const_reference pvVar4;
  ProgramSources *pPVar5;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  char *pcVar6;
  char *local_1000;
  GLint local_e28;
  bool local_e21;
  string local_e18;
  string local_df8;
  string local_dd8;
  ShaderSource local_db8;
  string local_d90;
  string local_d70;
  string local_d50;
  ShaderSource local_d30;
  string local_d08;
  string local_ce8;
  string local_cc8;
  ShaderSource local_ca8;
  string local_c80;
  string local_c60;
  string local_c40;
  ShaderSource local_c20;
  ProgramSources local_bf8;
  undefined1 local_b28 [8];
  ProgramSources sources;
  allocator<char> local_a31;
  string local_a30;
  byte local_a0b;
  byte local_a0a;
  allocator<char> local_a09;
  string local_a08;
  undefined1 local_9e8 [8];
  string uname;
  int bindNdx;
  byte local_99b;
  byte local_99a;
  allocator<char> local_999;
  string local_998;
  string local_978;
  string local_958;
  byte local_933;
  byte local_932;
  allocator<char> local_931;
  string local_930;
  byte local_90b;
  byte local_90a;
  allocator<char> local_909;
  string local_908;
  string local_8e8;
  string local_8c8;
  byte local_8a3;
  byte local_8a2;
  allocator<char> local_8a1;
  string local_8a0;
  byte local_87b;
  byte local_87a;
  allocator<char> local_879;
  string local_878;
  string local_858;
  string local_838;
  byte local_813;
  byte local_812;
  allocator<char> local_811;
  string local_810;
  byte local_7eb;
  byte local_7ea;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  int local_784;
  GLint local_780;
  int declNdx;
  int numDeclarations;
  bool arrayInstance;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  undefined1 local_300 [8];
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  UBOBindingNegativeCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragmentUniformDecl.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalUniformDecl.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&numDeclarations);
  local_e21 = true;
  if ((this->super_LayoutBindingNegativeCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    local_e21 = (this->super_LayoutBindingNegativeCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  declNdx._3_1_ = local_e21;
  if (local_e21 == false) {
    local_e28 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  }
  else {
    local_e28 = 1;
  }
  local_780 = local_e28;
  for (local_784 = 0; local_784 < local_780; local_784 = local_784 + 1) {
    poVar3 = std::operator<<((ostream *)&fragmentUniformDecl.field_0x170,"layout(std140, binding = "
                            );
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_vertexShaderBinding,
                        (long)local_784);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,") uniform ");
    getUniformName(&local_7a8,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_784);
    poVar3 = std::operator<<(poVar3,(string *)&local_7a8);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color1;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color2;\n");
    poVar3 = std::operator<<(poVar3,"} ");
    local_7ea = 0;
    local_7eb = 0;
    local_812 = 0;
    local_813 = 0;
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_812 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"colors",&local_811);
      local_813 = 1;
      getUniformName(&local_7c8,&local_810,local_784);
    }
    else {
      std::allocator<char>::allocator();
      local_7ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"colors",&local_7e9);
      local_7eb = 1;
      getUniformName(&local_7c8,&local_7e8,local_784,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_7c8);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_7c8);
    if ((local_813 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_810);
    }
    if ((local_812 & 1) != 0) {
      std::allocator<char>::~allocator(&local_811);
    }
    if ((local_7eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_7e8);
    }
    if ((local_7ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_7e9);
    }
    std::__cxx11::string::~string((string *)&local_7a8);
    poVar3 = std::operator<<((ostream *)local_300,"layout(std140, binding = ");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding,
                        (long)local_784);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,") uniform ");
    getUniformName(&local_838,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_784);
    poVar3 = std::operator<<(poVar3,(string *)&local_838);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color1;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color2;\n");
    poVar3 = std::operator<<(poVar3,"} ");
    local_87a = 0;
    local_87b = 0;
    local_8a2 = 0;
    local_8a3 = 0;
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_8a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"colors",&local_8a1);
      local_8a3 = 1;
      getUniformName(&local_858,&local_8a0,local_784);
    }
    else {
      std::allocator<char>::allocator();
      local_87a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"colors",&local_879);
      local_87b = 1;
      getUniformName(&local_858,&local_878,local_784,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_858);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_858);
    if ((local_8a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_8a0);
    }
    if ((local_8a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_8a1);
    }
    if ((local_87b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_878);
    }
    if ((local_87a & 1) != 0) {
      std::allocator<char>::~allocator(&local_879);
    }
    std::__cxx11::string::~string((string *)&local_838);
    poVar3 = std::operator<<((ostream *)&tessEvalUniformDecl.field_0x170,"layout(std140, binding = "
                            );
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding,
                        (long)local_784);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,") uniform ");
    getUniformName(&local_8c8,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_784);
    poVar3 = std::operator<<(poVar3,(string *)&local_8c8);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color1;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color2;\n");
    poVar3 = std::operator<<(poVar3,"} ");
    local_90a = 0;
    local_90b = 0;
    local_932 = 0;
    local_933 = 0;
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_932 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"colors",&local_931);
      local_933 = 1;
      getUniformName(&local_8e8,&local_930,local_784);
    }
    else {
      std::allocator<char>::allocator();
      local_90a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"colors",&local_909);
      local_90b = 1;
      getUniformName(&local_8e8,&local_908,local_784,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_8e8);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_8e8);
    if ((local_933 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_930);
    }
    if ((local_932 & 1) != 0) {
      std::allocator<char>::~allocator(&local_931);
    }
    if ((local_90b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_908);
    }
    if ((local_90a & 1) != 0) {
      std::allocator<char>::~allocator(&local_909);
    }
    std::__cxx11::string::~string((string *)&local_8c8);
    poVar3 = std::operator<<((ostream *)&shaderBody.field_0x170,"layout(std140, binding = ");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding,
                        (long)local_784);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,") uniform ");
    getUniformName(&local_958,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_784);
    poVar3 = std::operator<<(poVar3,(string *)&local_958);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color1;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color2;\n");
    poVar3 = std::operator<<(poVar3,"} ");
    local_99a = 0;
    local_99b = 0;
    uname.field_2._M_local_buf[0xe] = '\0';
    uname.field_2._M_local_buf[0xd] = '\0';
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      uname.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bindNdx,"colors",(allocator<char> *)(uname.field_2._M_local_buf + 0xf));
      uname.field_2._M_local_buf[0xd] = '\x01';
      getUniformName(&local_978,(string *)&bindNdx,local_784);
    }
    else {
      std::allocator<char>::allocator();
      local_99a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"colors",&local_999);
      local_99b = 1;
      getUniformName(&local_978,&local_998,local_784,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_978);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_978);
    if ((uname.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&bindNdx);
    }
    if ((uname.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(uname.field_2._M_local_buf + 0xf));
    }
    if ((local_99b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_998);
    }
    if ((local_99a & 1) != 0) {
      std::allocator<char>::~allocator(&local_999);
    }
    std::__cxx11::string::~string((string *)&local_958);
  }
  for (uname.field_2._8_4_ = 0; iVar1 = (this->super_LayoutBindingNegativeCase).m_numBindings,
      SBORROW4(uname.field_2._8_4_,iVar1 * 2) != uname.field_2._8_4_ + iVar1 * -2 < 0;
      uname.field_2._8_4_ = uname.field_2._8_4_ + 1) {
    local_a0a = 0;
    local_a0b = 0;
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"colors",&local_a31);
      getUniformName((string *)local_9e8,&local_a30,(int)uname.field_2._8_4_ / 2);
      std::__cxx11::string::~string((string *)&local_a30);
      std::allocator<char>::~allocator(&local_a31);
    }
    else {
      std::allocator<char>::allocator();
      local_a0a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"colors",&local_a09);
      local_a0b = 1;
      getUniformName((string *)local_9e8,&local_a08,0,(int)uname.field_2._8_4_ / 2);
    }
    if ((local_a0b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a08);
    }
    if ((local_a0a & 1) != 0) {
      std::allocator<char>::~allocator(&local_a09);
    }
    poVar3 = std::operator<<((ostream *)&numDeclarations,"\t");
    pcVar6 = "else if";
    if (uname.field_2._8_4_ == 0) {
      pcVar6 = "if";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3," (u_arrayNdx == ");
    de::toString<int>((string *)&sources.separable,(int *)(uname.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,(string *)&sources.separable);
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"\t{\n");
    poVar3 = std::operator<<(poVar3,"\t\tcolor = ");
    poVar3 = std::operator<<(poVar3,(string *)local_9e8);
    if ((int)uname.field_2._8_4_ % 2 == 0) {
      local_1000 = ".color1";
    }
    else {
      local_1000 = ".color2";
    }
    poVar3 = std::operator<<(poVar3,local_1000);
    poVar3 = std::operator<<(poVar3,";\n");
    std::operator<<(poVar3,"\t}\n");
    std::__cxx11::string::~string((string *)&sources.separable);
    std::__cxx11::string::~string((string *)local_9e8);
  }
  poVar3 = std::operator<<((ostream *)&numDeclarations,"\telse\n");
  poVar3 = std::operator<<(poVar3,"\t{\n");
  poVar3 = std::operator<<(poVar3,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar3,"\t}\n");
  glu::ProgramSources::ProgramSources(&local_bf8);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateVertexShader(&local_c40,SVar2,&local_c60,&local_c80);
  glu::VertexSource::VertexSource((VertexSource *)&local_c20,&local_c40);
  pPVar5 = glu::ProgramSources::operator<<(&local_bf8,&local_c20);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateFragmentShader(&local_cc8,SVar2,&local_ce8,&local_d08);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_ca8,&local_cc8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,&local_ca8);
  glu::ProgramSources::ProgramSources((ProgramSources *)local_b28,pPVar5);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_ce8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_c20);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c60);
  glu::ProgramSources::~ProgramSources(&local_bf8);
  if (((this->super_LayoutBindingNegativeCase).m_tessSupport & 1U) != 0) {
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    generateTessControlShader(&local_d50,SVar2,&local_d70,&local_d90);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_d30,&local_d50);
    pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)local_b28,&local_d30);
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    generateTessEvaluationShader(&local_dd8,SVar2,&local_df8,&local_e18);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_db8,&local_dd8);
    glu::ProgramSources::operator<<(pPVar5,&local_db8);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_db8);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::__cxx11::string::~string((string *)&local_e18);
    std::__cxx11::string::~string((string *)&local_df8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_d30);
    std::__cxx11::string::~string((string *)&local_d50);
    std::__cxx11::string::~string((string *)&local_d90);
    std::__cxx11::string::~string((string *)&local_d70);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext
                        ((this->super_LayoutBindingNegativeCase).super_TestCase.m_context);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_b28);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_b28);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&numDeclarations);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalUniformDecl.field_0x170);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragmentUniformDecl.field_0x170);
  return this_00;
}

Assistant:

glu::ShaderProgram* UBOBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(std140, binding = " << m_vertexShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		fragmentUniformDecl << "layout(std140, binding = " << m_fragmentShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessCtrlUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessEvalUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}